

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O0

StatementBlockSymbol *
slang::ast::StatementBlockSymbol::fromSyntax(Scope *scope,RsCodeBlockSyntax *syntax)

{
  Compilation *__str;
  SourceLocation args;
  StatementBlockSymbol *this;
  SyntaxNode *in_RSI;
  Scope *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> bVar1;
  Token TVar2;
  span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL> sVar3;
  StatementBlockSymbol *result;
  Compilation *comp;
  SyntaxList<slang::syntax::SyntaxNode> *in_stack_00000158;
  Scope *in_stack_00000160;
  size_t in_stack_ffffffffffffff88;
  pointer local_60;
  SyntaxNode *in_stack_ffffffffffffffb8;
  BumpAllocator *this_00;
  
  __str = Scope::getCompilation(in_RDI);
  bVar1 = ::sv((char *)__str,in_stack_ffffffffffffff88);
  this_00 = (BumpAllocator *)bVar1._M_len;
  TVar2 = slang::syntax::SyntaxNode::getFirstToken(in_stack_ffffffffffffffb8);
  args = parsing::Token::location((Token *)&stack0xffffffffffffffb8);
  this = BumpAllocator::
         emplace<slang::ast::StatementBlockSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::StatementBlockKind,slang::ast::VariableLifetime>
                   (this_00,(Compilation *)args,
                    (basic_string_view<char,_std::char_traits<char>_> *)TVar2.info,TVar2._0_8_,
                    (StatementBlockKind *)0x0,(VariableLifetime *)local_60);
  Symbol::setSyntax(&this->super_Symbol,in_RSI);
  sVar3 = Statement::createAndAddBlockItems(in_stack_00000160,in_stack_00000158);
  local_60 = sVar3._M_ptr;
  (this->blocks)._M_ptr = local_60;
  (this->blocks)._M_extent._M_extent_value = sVar3._M_extent._M_extent_value._M_extent_value;
  return this;
}

Assistant:

StatementBlockSymbol& StatementBlockSymbol::fromSyntax(const Scope& scope,
                                                       const RsCodeBlockSyntax& syntax) {
    auto& comp = scope.getCompilation();
    auto result = comp.emplace<StatementBlockSymbol>(comp, ""sv, syntax.getFirstToken().location(),
                                                     StatementBlockKind::Sequential,
                                                     VariableLifetime::Automatic);
    result->setSyntax(syntax);
    result->blocks = Statement::createAndAddBlockItems(*result, syntax.items);
    return *result;
}